

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O1

int lj_str_haspattern(GCstr *s)

{
  byte bVar1;
  uint uVar2;
  void *pvVar3;
  GCstr *pGVar4;
  
  uVar2 = s->len;
  if ((ulong)uVar2 != 0) {
    pGVar4 = s + 1;
    do {
      bVar1 = (byte)(pGVar4->nextgc).gcptr32;
      if (((""[(ulong)bVar1 + 1] & 4) != 0) &&
         (pvVar3 = memchr("^$*+?.([%-",(uint)bVar1,0xb), pvVar3 != (void *)0x0)) {
        return 1;
      }
      pGVar4 = (GCstr *)((long)&(pGVar4->nextgc).gcptr32 + 1);
    } while (pGVar4 < (GCstr *)((long)&s[1].nextgc.gcptr32 + (ulong)uVar2));
  }
  return 0;
}

Assistant:

int lj_str_haspattern(GCstr *s)
{
  const char *p = strdata(s), *q = p + s->len;
  while (p < q) {
    int c = *(const uint8_t *)p++;
    if (lj_char_ispunct(c) && strchr("^$*+?.([%-", c))
      return 1;  /* Found a pattern matching char. */
  }
  return 0;  /* No pattern matching chars found. */
}